

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

Node * __thiscall llvm::FoldingSetBase::GetOrInsertNode(FoldingSetBase *this,Node *N)

{
  Node *pNVar1;
  void *IP;
  FoldingSetNodeID ID;
  void *local_b0;
  FoldingSetNodeID local_a8;
  
  local_a8.Bits.super_SmallVectorImpl<unsigned_int>.
  super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX =
       &local_a8.Bits.super_SmallVectorStorage<unsigned_int,_32U>;
  local_a8.Bits.super_SmallVectorImpl<unsigned_int>.
  super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = 0;
  local_a8.Bits.super_SmallVectorImpl<unsigned_int>.
  super_SmallVectorTemplateBase<unsigned_int,_true>.
  super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity = 0x20;
  (*this->_vptr_FoldingSetBase[1])(this,N,&local_a8);
  pNVar1 = FindNodeOrInsertPos(this,&local_a8,&local_b0);
  if (pNVar1 == (Node *)0x0) {
    InsertNode(this,N,local_b0);
    pNVar1 = N;
  }
  SmallVectorImpl<unsigned_int>::~SmallVectorImpl((SmallVectorImpl<unsigned_int> *)&local_a8);
  return pNVar1;
}

Assistant:

FoldingSetBase::Node *FoldingSetBase::GetOrInsertNode(FoldingSetBase::Node *N) {
  FoldingSetNodeID ID;
  GetNodeProfile(N, ID);
  void *IP;
  if (Node *E = FindNodeOrInsertPos(ID, IP))
    return E;
  InsertNode(N, IP);
  return N;
}